

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spectrum.c
# Opt level: O1

void zx_draw(zxspectrum_t *state,zxbox_t *dirty)

{
  pthread_mutex_t *__mutex;
  zxspectrum_t *pzVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  attribute_t *__dest;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  __mutex = (pthread_mutex_t *)(state[1].screen.pixels + 0x18);
  pthread_mutex_lock(__mutex);
  if ((dirty == (zxbox_t *)0x0) ||
     ((((uVar3 = dirty->x0, (int)uVar3 < 1 && (dirty->y0 < 1)) && (0xff < dirty->x1)) &&
      (0xbf < dirty->y1)))) {
    memcpy(state[1].screen.pixels + 0x50,&state->screen,0x1b08);
    pzVar1 = state + 1;
    (pzVar1->screen).pixels[0x40] = '\0';
    (pzVar1->screen).pixels[0x41] = '\0';
    (pzVar1->screen).pixels[0x42] = '\0';
    (pzVar1->screen).pixels[0x43] = 0x80;
    (pzVar1->screen).pixels[0x44] = '\0';
    (pzVar1->screen).pixels[0x45] = '\0';
    (pzVar1->screen).pixels[0x46] = '\0';
    (pzVar1->screen).pixels[0x47] = 0x80;
    pzVar1 = state + 1;
    (pzVar1->screen).pixels[0x48] = 0xff;
    (pzVar1->screen).pixels[0x49] = 0xff;
    (pzVar1->screen).pixels[0x4a] = 0xff;
    (pzVar1->screen).pixels[0x4b] = '\x7f';
    (pzVar1->screen).pixels[0x4c] = 0xff;
    (pzVar1->screen).pixels[0x4d] = 0xff;
    (pzVar1->screen).pixels[0x4e] = 0xff;
    (pzVar1->screen).pixels[0x4f] = '\x7f';
  }
  else {
    uVar8 = uVar3 >> 3;
    if ((int)uVar3 < 1) {
      uVar8 = 0;
    }
    uVar7 = 0x1f;
    if ((int)uVar3 < 0xff) {
      uVar7 = uVar8;
    }
    iVar5 = dirty->x1;
    uVar3 = 0;
    if (0 < dirty->y0) {
      uVar3 = dirty->y0;
    }
    if (0xbe < (int)uVar3) {
      uVar3 = 0xbf;
    }
    uVar8 = 0x20;
    if (iVar5 < 0x100) {
      uVar8 = 1;
    }
    uVar2 = iVar5 + 7U >> 3;
    if (iVar5 - 0x100U < 0xffffff02) {
      uVar2 = uVar8;
    }
    iVar5 = 1;
    if (1 < dirty->y1) {
      iVar5 = dirty->y1;
    }
    if (0xbf < iVar5) {
      iVar5 = 0xc0;
    }
    uVar8 = 0xc0U - iVar5;
    if ((int)uVar3 < iVar5) {
      do {
        uVar6 = (ulong)((((uVar8 >> 3 ^ uVar8) & 7) * 9 ^ uVar8) * 0x20 + uVar7);
        memcpy(state[1].screen.pixels + uVar6 + 0x58,(state->screen).pixels + uVar6,
               (long)(int)(uVar2 - uVar7));
        uVar8 = uVar8 + 1;
      } while (uVar8 < -uVar3 + 0xc0);
    }
    uVar8 = 0xc0U - iVar5 >> 3;
    uVar3 = (int)(-uVar3 + 199) >> 3;
    if ((int)uVar8 < (int)uVar3) {
      lVar4 = (ulong)uVar3 - (ulong)uVar8;
      __dest = state[1].screen.attributes + (ulong)(uVar8 << 5) + (ulong)uVar7 + 0x58;
      do {
        memcpy(__dest,__dest + -0x1b88,(long)(int)(uVar2 - uVar7));
        __dest = __dest + 0x20;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    uVar6 = *(ulong *)(state[1].screen.pixels + 0x40);
    uVar10._0_4_ = dirty->x0;
    uVar10._4_4_ = dirty->y0;
    uVar9 = CONCAT44(-(uint)((int)(uVar6 >> 0x20) < (int)uVar10._4_4_),
                     -(uint)((int)uVar6 < (int)(undefined4)uVar10));
    *(ulong *)(state[1].screen.pixels + 0x40) = ~uVar9 & uVar10 | uVar6 & uVar9;
    uVar6 = *(ulong *)(state[1].screen.pixels + 0x48);
    uVar9._0_4_ = dirty->x1;
    uVar9._4_4_ = dirty->y1;
    uVar10 = CONCAT44(-(uint)((int)uVar9._4_4_ < (int)(uVar6 >> 0x20)),
                      -(uint)((int)(undefined4)uVar9 < (int)uVar6));
    *(ulong *)(state[1].screen.pixels + 0x48) = ~uVar10 & uVar9 | uVar6 & uVar10;
  }
  pthread_mutex_unlock(__mutex);
  (*state[1].draw)((zxspectrum_t *)dirty,(zxbox_t *)state[1].out);
  return;
}

Assistant:

static void zx_draw(zxspectrum_t *state, const zxbox_t *dirty)
{
  zxspectrum_private_t *prv = (zxspectrum_private_t *) state;

  mutex_lock(prv->lock);

  /* If no dirty rectangle was specified then assume the full screen. */
  if (dirty == NULL || zxbox_exceeds(dirty, SCREEN_WIDTH, SCREEN_HEIGHT))
  {
    /* Entire screen has been modified - copy it all. */
    memcpy(&prv->screen_copy, &prv->pub.screen, sizeof(prv->screen_copy));

    /* Maximise the overall dirty box that zxspectrum_claim_screen() will
     * use. */
    zxbox_maximise(&prv->dirty);
  }
  else
  {
    /* Copy pub.screen's dirty region into the screen copy. */

    zxbox_t box;
    int     width;
    int     height;
    int     linear_y;

    /* Clamp the dirty rectangle to the screen dimensions. */
    box.x0 = CLAMP(dirty->x0, 0, 255);
    box.y0 = CLAMP(dirty->y0, 0, 191);
    box.x1 = CLAMP(dirty->x1, 1, 256);
    box.y1 = CLAMP(dirty->y1, 1, 192);

    /* Divide down the x coordinates to get byte-sized quantities. */
    box.x0 = (box.x0    ) >> 3; /* divide to 0..31 rounding down */
    box.x1 = (box.x1 + 7) >> 3; /* divide to 0..31 rounding up */

    width = box.x1 - box.x0;

    /* Convert y coordinates into screen space - (0,0) is top left. */
    height = box.y1 - box.y0;
    box.y0 = 192 - box.y1;
    box.y1 = box.y0 + height;

    for (linear_y = box.y0; linear_y < box.y1; linear_y++)
    {
      /* Transpose fields using XOR */
      unsigned int tmp = (linear_y ^ (linear_y >> 3)) & 7;
      int          y   = linear_y ^ (tmp | (tmp << 3));

      memcpy(&prv->screen_copy.pixels[y * 32 + box.x0],
             &prv->pub.screen.pixels[y * 32 + box.x0],
             width);
    }

    /* Divide down the y coordinates to get attribute-sized quantities. */
    box.y0 = (box.y0    ) >> 3;
    box.y1 = (box.y1 + 7) >> 3;

    for (linear_y = box.y0; linear_y < box.y1; linear_y++)
    {
      memcpy(&prv->screen_copy.attributes[linear_y * 32 + box.x0],
             &prv->pub.screen.attributes[linear_y * 32 + box.x0],
             width);
    }

    /* Union the overall dirty box that zxspectrum_claim_screen() will use
     * with the outstanding one. */
    zxbox_union(&prv->dirty, dirty, &prv->dirty);
  }

  mutex_unlock(prv->lock);

  prv->config.draw(dirty, prv->config.opaque);
}